

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::OneHotEncoder::MergePartialFromCodedStream
          (OneHotEncoder *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  StringVector *value_00;
  Int64Vector *value_01;
  char cVar6;
  ulong uVar7;
  int value;
  int local_2c;
  
LAB_001f0534:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001f0557;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001f0557:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_001f0578:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      cVar6 = (char)uVar7;
      if (uVar5 == 0xb) {
        if (cVar6 != 'X') goto LAB_001f0578;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&local_2c);
        if (!bVar3) {
          return false;
        }
        this->handleunknown_ = local_2c;
        goto LAB_001f0534;
      }
      if (uVar5 == 2) {
        if (cVar6 == '\x12') {
          value_01 = mutable_int64categories(this);
          bVar3 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_01);
          goto LAB_001f0598;
        }
        goto LAB_001f0578;
      }
      if (uVar5 == 10) {
        if (cVar6 != 'P') goto LAB_001f0578;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->outputsparse_);
      }
      else {
        if ((uVar5 != 1) || (cVar6 != '\n')) goto LAB_001f0578;
        value_00 = mutable_stringcategories(this);
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_00);
      }
    }
LAB_001f0598:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool OneHotEncoder::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.OneHotEncoder)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.StringVector stringCategories = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringcategories()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64Categories = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64categories()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool outputSparse = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &outputsparse_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_handleunknown(static_cast< ::CoreML::Specification::OneHotEncoder_HandleUnknown >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.OneHotEncoder)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.OneHotEncoder)
  return false;
#undef DO_
}